

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O1

int __thiscall UdpBitDht::tick(UdpBitDht *this)

{
  int iVar1;
  int iVar2;
  sockaddr_in toAddr;
  char data [1024];
  uint local_44c;
  sockaddr_in local_448;
  char local_438 [1032];
  
  pthread_mutex_lock((pthread_mutex_t *)&this->dhtMtx);
  iVar2 = 0;
  do {
    local_44c = 0x400;
    iVar1 = bdNode::outgoingMsg(&this->mBitDhtManager->super_bdNode,&local_448,local_438,
                                (int *)&local_44c);
    if (iVar1 == 0) goto LAB_0011286e;
    this->mWriteBytes = this->mWriteBytes + local_44c;
    (*(this->super_UdpSubReceiver).super_UdpReceiver._vptr_UdpReceiver[4])
              (this,local_438,(ulong)local_44c,&local_448,0x40);
    iVar2 = iVar2 + 1;
    local_44c = 0x400;
  } while (iVar2 != 100);
  iVar2 = 100;
LAB_0011286e:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dhtMtx);
  return (int)(iVar2 == 100);
}

Assistant:

int UdpBitDht::tick() {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	/* pass on messages from the node */
	int i = 0;
	char data[BITDHT_MAX_PKTSIZE];
	struct sockaddr_in toAddr;
	int size = BITDHT_MAX_PKTSIZE;

	while((i < MAX_MSG_PER_TICK) && (mBitDhtManager->outgoingMsg(&toAddr, data, &size))) {
#ifdef DEBUG_UDP_BITDHT 
		std::cerr << "UdpBitDht::tick() outgoing msg(" << size << ") to " << toAddr;
		std::cerr << std::endl;
#endif

		mWriteBytes += size;
		sendPkt(data, size, toAddr, BITDHT_TTL);

		// iterate
		i++;
		size = BITDHT_MAX_PKTSIZE; // reset msg size!
	}

	if (i == MAX_MSG_PER_TICK)
		return 1; /* keep on ticking */
	return 0;
}